

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O2

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,ui32_t HeaderSize)

{
  ILogSink *this_00;
  TimedTextDescriptor *this_01;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  allocator<char> local_89;
  h__WriterState local_88 [26];
  
  if (*(int *)&filename[0x1b].field_2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,*(char **)CONCAT44(in_register_00000014,HeaderSize),&local_89);
    Kumu::FileWriter::OpenWrite((string *)this);
    std::__cxx11::string::~string((string *)local_88);
    if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      *(undefined4 *)&filename[2]._M_string_length = in_ECX;
      this_01 = (TimedTextDescriptor *)operator_new(0x278);
      ASDCP::MXF::TimedTextDescriptor::TimedTextDescriptor
                (this_01,(Dictionary *)filename->_M_string_length);
      *(TimedTextDescriptor **)((long)&filename[0x18].field_2 + 8) = this_01;
      ASDCP::MXF::h__WriterState::Goto_INIT(local_88);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_88);
      Kumu::Result_t::~Result_t((Result_t *)local_88);
    }
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
               ,0x1b6);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ui32_t HeaderSize)
{
  if ( ! m_State.Test_BEGIN() )
    {
      KM_RESULT_STATE_HERE();
      return RESULT_STATE;
    }

  Result_t result = m_File.OpenWrite(filename.c_str());

  if ( ASDCP_SUCCESS(result) )
    {
      m_HeaderSize = HeaderSize;
      m_EssenceDescriptor = new ASDCP::MXF::TimedTextDescriptor(m_Dict);
      result = m_State.Goto_INIT();
    }

  return result;
}